

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O0

void __thiscall
Diligent::DearchiverBase::PSOData<Diligent::GraphicsPipelineStateCreateInfo>::AssignShaders
          (PSOData<Diligent::GraphicsPipelineStateCreateInfo> *this)

{
  undefined *puVar1;
  bool bVar2;
  int iVar3;
  RefCntAutoPtr *this_00;
  IShader *pIVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  undefined1 local_58 [8];
  string _msg;
  SHADER_TYPE ShaderType;
  RefCntAutoPtr<Diligent::IShader> *Shader;
  iterator __end1;
  iterator __begin1;
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  *__range1;
  PSOData<Diligent::GraphicsPipelineStateCreateInfo> *this_local;
  
  __end1 = std::
           vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
           ::begin(&this->Shaders);
  Shader = (RefCntAutoPtr<Diligent::IShader> *)
           std::
           vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
           ::end(&this->Shaders);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Diligent::RefCntAutoPtr<Diligent::IShader>_*,_std::vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>_>
                                *)&Shader);
    if (!bVar2) {
      return;
    }
    this_00 = (RefCntAutoPtr *)
              __gnu_cxx::
              __normal_iterator<Diligent::RefCntAutoPtr<Diligent::IShader>_*,_std::vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>_>
              ::operator*(&__end1);
    pIVar4 = RefCntAutoPtr<Diligent::IShader>::operator->
                       ((RefCntAutoPtr<Diligent::IShader> *)this_00);
    iVar3 = (*(pIVar4->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    _msg.field_2._12_4_ = *(int *)(CONCAT44(extraout_var,iVar3) + 8);
    if (_msg.field_2._12_4_ == 1) {
      pIVar4 = Diligent::RefCntAutoPtr::operator_cast_to_IShader_(this_00);
      AssignShader(&(this->CreateInfo).pVS,pIVar4,_msg.field_2._12_4_);
    }
    else if (_msg.field_2._12_4_ == 2) {
      pIVar4 = Diligent::RefCntAutoPtr::operator_cast_to_IShader_(this_00);
      AssignShader(&(this->CreateInfo).pPS,pIVar4,_msg.field_2._12_4_);
    }
    else if (_msg.field_2._12_4_ == 4) {
      pIVar4 = Diligent::RefCntAutoPtr::operator_cast_to_IShader_(this_00);
      AssignShader(&(this->CreateInfo).pGS,pIVar4,_msg.field_2._12_4_);
    }
    else if (_msg.field_2._12_4_ == 8) {
      pIVar4 = Diligent::RefCntAutoPtr::operator_cast_to_IShader_(this_00);
      AssignShader(&(this->CreateInfo).pHS,pIVar4,_msg.field_2._12_4_);
    }
    else if (_msg.field_2._12_4_ == 0x10) {
      pIVar4 = Diligent::RefCntAutoPtr::operator_cast_to_IShader_(this_00);
      AssignShader(&(this->CreateInfo).pDS,pIVar4,_msg.field_2._12_4_);
    }
    else if (_msg.field_2._12_4_ == 0x40) {
      pIVar4 = Diligent::RefCntAutoPtr::operator_cast_to_IShader_(this_00);
      AssignShader(&(this->CreateInfo).pAS,pIVar4,_msg.field_2._12_4_);
    }
    else {
      if (_msg.field_2._12_4_ != 0x80) {
        FormatString<char[46]>
                  ((string *)local_58,(char (*) [46])"Unsupported shader type for graphics pipeline"
                  );
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar5 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(2,uVar5,0);
        }
        std::__cxx11::string::~string((string *)local_58);
        return;
      }
      pIVar4 = Diligent::RefCntAutoPtr::operator_cast_to_IShader_(this_00);
      AssignShader(&(this->CreateInfo).pMS,pIVar4,_msg.field_2._12_4_);
    }
    __gnu_cxx::
    __normal_iterator<Diligent::RefCntAutoPtr<Diligent::IShader>_*,_std::vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void DearchiverBase::PSOData<GraphicsPipelineStateCreateInfo>::AssignShaders()
{
    for (RefCntAutoPtr<IShader>& Shader : Shaders)
    {
        const SHADER_TYPE ShaderType = Shader->GetDesc().ShaderType;
        switch (ShaderType)
        {
            // clang-format off
            case SHADER_TYPE_VERTEX:        AssignShader(CreateInfo.pVS, Shader, ShaderType); break;
            case SHADER_TYPE_PIXEL:         AssignShader(CreateInfo.pPS, Shader, ShaderType); break;
            case SHADER_TYPE_GEOMETRY:      AssignShader(CreateInfo.pGS, Shader, ShaderType); break;
            case SHADER_TYPE_HULL:          AssignShader(CreateInfo.pHS, Shader, ShaderType); break; 
            case SHADER_TYPE_DOMAIN:        AssignShader(CreateInfo.pDS, Shader, ShaderType); break;
            case SHADER_TYPE_AMPLIFICATION: AssignShader(CreateInfo.pAS, Shader, ShaderType); break;
            case SHADER_TYPE_MESH:          AssignShader(CreateInfo.pMS, Shader, ShaderType); break;
            // clang-format on
            default:
                LOG_ERROR_MESSAGE("Unsupported shader type for graphics pipeline");
                return;
        }
    }
}